

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

void SkipSpace(ConfigScanner *sc)

{
  ConfigScanner *sc_local;
  
  if (sc != (ConfigScanner *)0x0) {
    while ((*sc->ptr == '\t' || (*sc->ptr == ' '))) {
      sc->ptr = sc->ptr + 1;
    }
  }
  return;
}

Assistant:

void SkipSpace(ConfigScanner *sc)
{
	if (sc == NULL)
	{
		return;
	}
	while (true)
	{
		switch (*sc->ptr)
		{
		case ' ':
		case '\t':
			sc->ptr++;
			continue;
		}
		return;
	}
}